

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_composite_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  ID id;
  uint uVar1;
  size_t sVar2;
  pointer pcVar3;
  InterfaceBlockMeta *pIVar4;
  SPIRFunction *pSVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  SPIRType *pSVar14;
  runtime_error *prVar15;
  undefined8 extraout_RAX;
  Bitset *pBVar16;
  SPIREntryPoint *pSVar17;
  const_iterator cVar18;
  const_iterator cVar19;
  mapped_type *pmVar20;
  const_iterator cVar21;
  _func_void *p_Var22;
  long *plVar23;
  uint uVar24;
  CompilerMSL *this_00;
  uint32_t auVar25 [2];
  SPIRType *ts_2;
  StorageClass SVar26;
  string flatten_from_ib_mbr_name;
  string mbr_name;
  uint local_1ec;
  InterfaceBlockMeta *local_1e8;
  uint32_t local_1dc;
  StorageClass local_1d8;
  char local_1d2;
  char local_1d1;
  SPIRType *local_1d0;
  undefined4 local_1c4;
  uint32_t local_1c0;
  undefined4 local_1bc;
  uint32_t local_1b8;
  undefined4 local_1b4;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [4];
  uint uStack_19c;
  uint32_t local_198 [2];
  long *local_190;
  long local_188;
  long local_180;
  ulong *local_178;
  char *local_170;
  ulong local_168;
  char cStack_160;
  char acStack_15f [7];
  char acStack_158 [8];
  char local_150 [5];
  char acStack_14b [3];
  uint local_148;
  undefined1 local_144;
  TypedID<(spirv_cross::Types)0> *local_140;
  size_t local_138;
  undefined8 local_130;
  char acStack_128 [8];
  SPIRFunction *local_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  undefined1 local_f8 [32];
  string *local_d8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_d0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_c8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_c0;
  SPIRVariable *local_b8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_b0;
  string local_a8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_88;
  SmallVector<std::function<void_()>,_0UL> *local_80;
  SPIRType *local_78;
  string local_70;
  string local_50;
  
  local_d8 = ib_var_ref;
  local_120 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_1e8 = meta;
  if (meta->strip_array == true) {
    pSVar14 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    pSVar14 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  ts_2 = pSVar14;
  bVar6 = add_component_variable_to_interface_block(this,storage,local_d8,var,pSVar14,local_1e8);
  if (bVar6) {
    return;
  }
  bVar6 = Compiler::is_matrix((Compiler *)this,pSVar14);
  local_1d0 = pSVar14;
  bVar7 = Compiler::is_array((Compiler *)this,pSVar14);
  pSVar14 = local_1d0;
  pIVar4 = local_1e8;
  if (bVar6) {
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1b0._0_8_ = local_1a0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,
                 "MSL cannot emit arrays-of-matrices in input and output variables.","");
      ::std::runtime_error::runtime_error(prVar15,(string *)local_1b0);
      *(undefined ***)prVar15 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1c0 = local_1d0->columns;
  }
  else {
    local_1c0 = 0;
    if (bVar7) {
      if ((local_1d0->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1b0._0_8_ = local_1a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,
                   "MSL cannot emit arrays-of-arrays in input and output variables.","");
        ::std::runtime_error::runtime_error(prVar15,(string *)local_1b0);
        *(undefined ***)prVar15 = &PTR__runtime_error_003f8e68;
        __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_1c0 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_1d0);
    }
  }
  bVar6 = Compiler::is_builtin_variable((Compiler *)this,var);
  local_1dc = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  local_1d1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationFlat);
  bVar7 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationNoPerspective);
  bVar8 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationCentroid);
  bVar9 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationSample);
  if (pSVar14->pointer != true) goto LAB_002b4b1d;
  do {
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (pSVar14->parent_type).id);
LAB_002b4b1d:
    bVar10 = Compiler::is_array((Compiler *)this,pSVar14);
  } while ((bVar10) ||
          (local_1d0 = pSVar14, bVar10 = Compiler::is_matrix((Compiler *)this,pSVar14),
          pSVar14 = local_1d0, bVar10));
  local_1d8 = storage;
  if (bVar6) {
    id.id = (var->super_IVariant).self.id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              ((string *)local_1b0,this,(ulong)local_1dc,7);
    Compiler::set_name((Compiler *)this,id,(string *)local_1b0);
    if ((SPIRVariable *)local_1b0._0_8_ != (SPIRVariable *)local_1a0) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  pSVar5 = local_120;
  SVar26 = local_1d8;
  local_f8._0_8_ = local_f8 + 0x10;
  local_f8._8_8_ = 0;
  local_f8[0x10] = '\0';
  local_b8 = var;
  if ((bVar6 && local_1d8 == StorageClassOutput) && local_1dc == 3) {
    uVar12 = (uint32_t)
             (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size;
    uVar11 = Compiler::get_variable_data_type_id((Compiler *)this,var);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
              (&ib_type->member_types,
               (ib_type->member_types).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size + 1);
    sVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    [sVar2].id = uVar11;
    (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = sVar2 + 1;
    ts_2 = (SPIRType *)0x3;
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar12,DecorationBuiltIn,3
              );
    var = local_b8;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_1b0,this,3,3);
    ::std::__cxx11::string::operator=((string *)local_f8,(string *)local_1b0);
    if ((SPIRVariable *)local_1b0._0_8_ != (SPIRVariable *)local_1a0) {
      operator_delete((void *)local_1b0._0_8_);
    }
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar12,(string *)local_f8)
    ;
    local_1b4 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    SVar26 = local_1d8;
    if ((this->msl_options).enable_clip_distance_user_varying == false) goto LAB_002b585a;
  }
  else {
    if (pIVar4->strip_array == false) {
      local_1e8 = (InterfaceBlockMeta *)CONCAT44(local_1e8._4_4_,(var->super_IVariant).self.id);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                (&local_120->local_variables,
                 (local_120->local_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1);
      sVar2 = (pSVar5->local_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
      (pSVar5->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
      [sVar2].id = (uint32_t)local_1e8;
      (pSVar5->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
      buffer_size = sVar2 + 1;
      uVar24 = (var->super_IVariant).self.id;
      SmallVector<unsigned_int,_8UL>::reserve
                (&this->vars_needing_early_declaration,
                 (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size +
                 1);
      sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
      (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar2] = uVar24;
      (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = sVar2 + 1;
    }
    local_1b4 = 0;
  }
  local_1ec = 0;
  if (local_1c0 != 0) {
    local_b0 = &ib_type->member_types;
    local_88 = &(this->fragment_output_components)._M_h;
    local_d0 = &(this->pull_model_inputs)._M_h;
    local_c8 = &(this->outputs_by_builtin)._M_h;
    local_c0 = &(this->inputs_by_builtin)._M_h;
    local_1d2 = local_1dc - 3 < 2 && bVar6;
    local_80 = &local_120->fixup_hooks_out;
    local_120 = (SPIRFunction *)&local_120->fixup_hooks_in;
    local_78 = ib_type;
    do {
      local_1e8 = (InterfaceBlockMeta *)
                  (ib_type->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      local_1b8 = (local_1d0->super_IVariant).self.id;
      pBVar16 = Compiler::get_decoration_bitset((Compiler *)this,(ID)(var->super_IVariant).self.id);
      if (((((pBVar16->lower & 0x40000000) == 0) ||
           ((this->msl_options).pad_fragment_output_components != true)) ||
          (pSVar17 = Compiler::get_entry_point((Compiler *)this), SVar26 != StorageClassOutput)) ||
         (pSVar17->model != ExecutionModelFragment)) {
        if (SVar26 != StorageClassInput) {
          local_1bc = 0;
          goto LAB_002b4f07;
        }
        local_1b0._0_4_ = (var->super_IVariant).self.id;
        cVar21 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(local_d0,(key_type *)local_1b0);
        if (cVar21.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          local_1bc = 0;
          local_1c4 = 1;
          goto LAB_002b4f14;
        }
        uVar12 = Compiler::get_pointee_type_id((Compiler *)this,local_1b8);
        uVar12 = build_msl_interpolant_type(this,uVar12,bVar7);
        local_1c4 = (undefined4)CONCAT71((uint7)(uint3)(uVar12 >> 8),1);
        local_1bc = 0;
      }
      else {
        uVar12 = Compiler::get_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
        local_1b0._0_4_ = uVar12 + local_1ec;
        cVar18 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(local_88,(key_type *)local_1b0);
        if (cVar18.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          uVar24 = 4;
        }
        else {
          uVar24 = *(uint *)((long)cVar18.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ._M_cur + 0xc);
        }
        uVar1 = local_1d0->vecsize;
        pSVar14 = local_1d0;
        if (uVar1 < uVar24) {
          local_1b8 = build_extended_vector_type
                                (this,(local_1d0->super_IVariant).self.id,uVar24,Unknown);
          pSVar14 = (SPIRType *)(ulong)local_1b8;
        }
        local_1bc = (undefined4)CONCAT71((int7)((ulong)pSVar14 >> 8),uVar1 < uVar24);
LAB_002b4f07:
        local_1c4 = 0;
LAB_002b4f14:
        uVar12 = Compiler::get_pointee_type_id((Compiler *)this,local_1b8);
      }
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                (local_b0,(ib_type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                          + 1);
      sVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
      (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      [sVar2].id = uVar12;
      (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = sVar2 + 1;
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)local_1b0,&this->super_CompilerGLSL,(var->super_IVariant).self.id,true);
      join<std::__cxx11::string,char_const(&)[2],unsigned_int&>
                (&local_50,(spirv_cross *)local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x366a8c,
                 (char (*) [2])&local_1ec,(uint *)ts_2);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      this_00 = (CompilerMSL *)0x376eff;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"m","");
      ensure_valid_name(&local_a8,this_00,&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((SPIRVariable *)local_1b0._0_8_ != (SPIRVariable *)local_1a0) {
        operator_delete((void *)local_1b0._0_8_);
      }
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                 &local_a8);
      pBVar16 = Compiler::get_decoration_bitset((Compiler *)this,(ID)(var->super_IVariant).self.id);
      if ((pBVar16->lower & 0x40000000) == 0) {
        if (bVar6) {
          bVar10 = Compiler::is_tessellation_shader((Compiler *)this);
          if ((bVar10 & (byte)local_1c4) == 1) {
            local_1b0._0_4_ = local_1dc;
            cVar19 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(local_c0,(key_type *)local_1b0);
            if (cVar19.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
                ._M_cur != (__node_type *)0x0) {
              local_1b0._0_4_ = local_1dc;
              pmVar20 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_c0,(key_type *)local_1b0);
              uVar12 = local_1ec + pmVar20->location;
              Compiler::set_member_decoration
                        ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,
                         (uint32_t)local_1e8,DecorationLocation,uVar12);
              mark_location_as_used_by_shader(this,uVar12,local_1d0,StorageClassInput,false);
              goto LAB_002b52bd;
            }
          }
          else if ((local_1d8 == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) != 0)
                  ) {
            local_1b0._0_4_ = local_1dc;
            cVar19 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(local_c8,(key_type *)local_1b0);
            if (cVar19.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
                ._M_cur != (__node_type *)0x0) {
              local_1b0._0_4_ = local_1dc;
              pmVar20 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_c8,(key_type *)local_1b0);
              uVar12 = local_1ec + pmVar20->location;
              Compiler::set_member_decoration
                        ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,
                         (uint32_t)local_1e8,DecorationLocation,uVar12);
              mark_location_as_used_by_shader(this,uVar12,local_1d0,StorageClassOutput,false);
              goto LAB_002b52bd;
            }
          }
        }
        if (local_1d2 != '\0') {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                     DecorationBuiltIn,local_1dc);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                     DecorationIndex,local_1ec);
        }
      }
      else {
        uVar12 = Compiler::get_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
        uVar12 = uVar12 + local_1ec;
        uVar11 = Compiler::get_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationComponent);
        if ((byte)local_1c4 != '\0') {
          uVar13 = ensure_correct_input_type
                             (this,*(uint32_t *)&(var->super_IVariant).field_0xc,uVar12,uVar11,0,
                              pIVar4->strip_array);
          *(uint32_t *)&(var->super_IVariant).field_0xc = uVar13;
          uVar13 = ensure_correct_input_type
                             (this,(local_1d0->super_IVariant).self.id,uVar12,uVar11,0,
                              pIVar4->strip_array);
          local_1b0._0_4_ = (var->super_IVariant).self.id;
          cVar21 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_d0,(key_type *)local_1b0);
          if (cVar21.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            uVar13 = build_msl_interpolant_type(this,uVar13,bVar7);
          }
          (local_b0->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
          [(ulong)local_1e8 & 0xffffffff].id = uVar13;
          var = local_b8;
          ib_type = local_78;
        }
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                   DecorationLocation,uVar12);
        if (uVar11 != 0) {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                     DecorationComponent,uVar11);
        }
        mark_location_as_used_by_shader(this,uVar12,local_1d0,local_1d8,false);
      }
LAB_002b52bd:
      pBVar16 = Compiler::get_decoration_bitset((Compiler *)this,(ID)(var->super_IVariant).self.id);
      if ((pBVar16->lower & 0x100000000) != 0) {
        uVar12 = Compiler::get_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationIndex);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                   DecorationIndex,uVar12);
      }
      if ((byte)local_1c4 == '\0') {
LAB_002b5321:
        if (local_1d1 != '\0') {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                     DecorationFlat,0);
        }
        if (bVar7) {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                     DecorationNoPerspective,0);
        }
        if (bVar8) {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                     DecorationCentroid,0);
        }
        if (bVar9) {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                     DecorationSample,0);
        }
      }
      else {
        local_1b0._0_4_ = (var->super_IVariant).self.id;
        cVar21 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(local_d0,(key_type *)local_1b0);
        if (cVar21.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
        goto LAB_002b5321;
      }
      uVar24 = (var->super_IVariant).self.id;
      ts_2 = (SPIRType *)(ulong)uVar24;
      Compiler::set_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,(uint32_t)local_1e8,
                 SPIRVCrossDecorationInterfaceOrigID,uVar24);
      SVar26 = local_1d8;
      if (pIVar4->strip_array == false) {
        if (local_1d8 == StorageClassOutput) {
          local_1b0[8] = (char)local_1bc;
          local_198[0] = local_1b8;
          local_190 = &local_180;
          pcVar3 = (local_d8->_M_dataplus)._M_p;
          local_1b0._0_8_ = var;
          _local_1a0 = this;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,pcVar3,pcVar3 + local_d8->_M_string_length);
          local_170 = &cStack_160;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,local_a8._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p + local_a8._M_string_length);
          local_150 = SUB85(local_1d0,0);
          acStack_14b = SUB83((ulong)local_1d0 >> 0x28,0);
          local_148 = local_1ec;
          local_144 = (undefined1)local_1b4;
          local_140 = (TypedID<(spirv_cross::Types)0> *)&local_130;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_f8._0_8_,(pointer)(local_f8._0_8_ + local_f8._8_8_))
          ;
          local_108 = (code *)0x0;
          pcStack_100 = (code *)0x0;
          local_118._M_unused._M_object = (void *)0x0;
          local_118._M_pod_data[8] = '\0';
          local_118._M_pod_data[9] = '\0';
          local_118._M_pod_data[10] = '\0';
          local_118._M_pod_data[0xb] = '\0';
          local_118._M_pod_data[0xc] = '\0';
          local_118._M_pod_data[0xd] = '\0';
          local_118._M_pod_data[0xe] = '\0';
          local_118._M_pod_data[0xf] = '\0';
          p_Var22 = (_func_void *)operator_new(0x90);
          *(undefined4 *)(p_Var22 + 0xc) = local_1b0._12_4_;
          *(undefined1 (*) [4])(p_Var22 + 0x10) = local_1a0;
          *(uint *)(p_Var22 + 0x14) = uStack_19c;
          *(uint32_t *)(p_Var22 + 0x18) = local_198[0];
          *(undefined4 *)p_Var22 = local_1b0._0_4_;
          *(undefined4 *)(p_Var22 + 4) = local_1b0._4_4_;
          *(undefined4 *)(p_Var22 + 8) = local_1b0._8_4_;
          *(undefined4 *)(p_Var22 + 0xc) = local_1b0._12_4_;
          *(_func_void **)(p_Var22 + 0x20) = p_Var22 + 0x30;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(p_Var22 + 0x20),local_190,local_188 + (long)local_190);
          *(_func_void **)(p_Var22 + 0x40) = p_Var22 + 0x50;
          if (local_170 == &cStack_160) {
            *(ulong *)(p_Var22 + 0x50) = CONCAT71(acStack_15f,cStack_160);
            *(char (*) [8])(p_Var22 + 0x58) = acStack_158;
          }
          else {
            *(char **)(p_Var22 + 0x40) = local_170;
            *(ulong *)(p_Var22 + 0x50) = CONCAT71(acStack_15f,cStack_160);
          }
          *(ulong *)(p_Var22 + 0x48) = local_168;
          local_168 = 0;
          cStack_160 = '\0';
          *(ulong *)(p_Var22 + 0x65) = CONCAT17(local_144,CONCAT43(local_148,acStack_14b));
          *(ulong *)(p_Var22 + 0x60) = CONCAT35(acStack_14b,local_150);
          *(_func_void **)(p_Var22 + 0x70) = p_Var22 + 0x80;
          if (local_140 == (TypedID<(spirv_cross::Types)0> *)&local_130) {
            *(ulong *)(p_Var22 + 0x80) = CONCAT71(local_130._1_7_,(undefined1)local_130);
            *(char (*) [8])(p_Var22 + 0x88) = acStack_128;
          }
          else {
            *(TypedID<(spirv_cross::Types)0> **)(p_Var22 + 0x70) = local_140;
            *(ulong *)(p_Var22 + 0x80) = CONCAT71(local_130._1_7_,(undefined1)local_130);
          }
          *(size_t *)(p_Var22 + 0x78) = local_138;
          local_138 = 0;
          local_130._0_1_ = 0;
          pcStack_100 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:2804:42)>
                        ::_M_invoke;
          local_108 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:2804:42)>
                      ::_M_manager;
          local_170 = &cStack_160;
          local_140 = (TypedID<(spirv_cross::Types)0> *)&local_130;
          local_118._M_unused._0_8_ = (undefined8)p_Var22;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (local_80,(function<void_()> *)&local_118);
          if (local_108 != (code *)0x0) {
            (*local_108)(&local_118,&local_118,__destroy_functor);
          }
          SVar26 = local_1d8;
          if (local_140 != (TypedID<(spirv_cross::Types)0> *)&local_130) {
            operator_delete(local_140);
          }
          if (local_170 != &cStack_160) {
            operator_delete(local_170);
          }
          plVar23 = &local_180;
          auVar25 = (uint32_t  [2])local_190;
        }
        else {
          if (local_1d8 != StorageClassInput) goto LAB_002b582c;
          local_1a0[1] = bVar9;
          local_1a0[0] = bVar8;
          uStack_19c = local_1ec;
          local_198 = (uint32_t  [2])&local_188;
          pcVar3 = (local_d8->_M_dataplus)._M_p;
          local_1b0._0_8_ = var;
          local_1b0._8_8_ = this;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_198,pcVar3,pcVar3 + local_d8->_M_string_length);
          local_178 = &local_168;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,local_a8._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p + local_a8._M_string_length);
          local_108 = (code *)0x0;
          pcStack_100 = (code *)0x0;
          local_118._M_unused._M_object = (void *)0x0;
          local_118._M_pod_data[8] = '\0';
          local_118._M_pod_data[9] = '\0';
          local_118._M_pod_data[10] = '\0';
          local_118._M_pod_data[0xb] = '\0';
          local_118._M_pod_data[0xc] = '\0';
          local_118._M_pod_data[0xd] = '\0';
          local_118._M_pod_data[0xe] = '\0';
          local_118._M_pod_data[0xf] = '\0';
          p_Var22 = (_func_void *)operator_new(0x58);
          *(undefined8 *)(p_Var22 + 0x10) = _local_1a0;
          *(undefined4 *)p_Var22 = local_1b0._0_4_;
          *(undefined4 *)(p_Var22 + 4) = local_1b0._4_4_;
          *(undefined4 *)(p_Var22 + 8) = local_1b0._8_4_;
          *(undefined4 *)(p_Var22 + 0xc) = local_1b0._12_4_;
          *(_func_void **)(p_Var22 + 0x18) = p_Var22 + 0x28;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(p_Var22 + 0x18),local_198,(long)local_190 + (long)local_198);
          *(_func_void **)(p_Var22 + 0x38) = p_Var22 + 0x48;
          if (local_178 == &local_168) {
            *(ulong *)(p_Var22 + 0x48) = local_168;
            *(ulong *)(p_Var22 + 0x50) = CONCAT71(acStack_15f,cStack_160);
          }
          else {
            *(ulong **)(p_Var22 + 0x38) = local_178;
            *(ulong *)(p_Var22 + 0x48) = local_168;
          }
          *(char **)(p_Var22 + 0x40) = local_170;
          local_170 = (char *)0x0;
          local_168 = local_168 & 0xffffffffffffff00;
          pcStack_100 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:2784:41)>
                        ::_M_invoke;
          local_108 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:2784:41)>
                      ::_M_manager;
          local_178 = &local_168;
          local_118._M_unused._0_8_ = (undefined8)p_Var22;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    ((SmallVector<std::function<void_()>,_0UL> *)local_120,
                     (function<void_()> *)&local_118);
          if (local_108 != (code *)0x0) {
            (*local_108)(&local_118,&local_118,__destroy_functor);
          }
          SVar26 = local_1d8;
          if (local_178 != &local_168) {
            operator_delete(local_178);
          }
          plVar23 = &local_188;
          auVar25 = local_198;
        }
        if (auVar25 != (uint32_t  [2])plVar23) {
          operator_delete((void *)auVar25);
        }
      }
LAB_002b582c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      local_1ec = local_1ec + 1;
    } while (local_1ec < local_1c0);
  }
LAB_002b585a:
  if ((Parameter *)local_f8._0_8_ != (Parameter *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_);
  }
  return;
}

Assistant:

void CompilerMSL::add_composite_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                            SPIRType &ib_type, SPIRVariable &var,
                                                            InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t elem_cnt = 0;

	if (add_component_variable_to_interface_block(storage, ib_var_ref, var, var_type, meta))
		return;

	if (is_matrix(var_type))
	{
		if (is_array(var_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		elem_cnt = var_type.columns;
	}
	else if (is_array(var_type))
	{
		if (var_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		elem_cnt = to_array_size_literal(var_type);
	}

	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	auto *usable_type = &var_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	// If a builtin, force it to have the proper name.
	if (is_builtin)
		set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(get_variable_data_type_id(var));
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}
	else if (!meta.strip_array)
	{
		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		entry_func.add_local_variable(var.self);
		// We need to declare the variable early and at entry-point scope.
		vars_needing_early_declaration.push_back(var.self);
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t target_components = 0;
		bool padded_output = false;
		uint32_t type_id = usable_type->self;

		// Check if we need to pad fragment output to match a certain number of components.
		if (get_decoration_bitset(var.self).get(DecorationLocation) && msl_options.pad_fragment_output_components &&
		    get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			target_components = get_target_components_for_fragment_location(locn);
			if (usable_type->vecsize < target_components)
			{
				// Make a new type here.
				type_id = build_extended_vector_type(usable_type->self, target_components);
				padded_output = true;
			}
		}

		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types.push_back(build_msl_interpolant_type(get_pointee_type_id(type_id), is_noperspective));
		else
			ib_type.member_types.push_back(get_pointee_type_id(type_id));

		// Give the member a name
		string mbr_name = ensure_valid_name(join(to_expression(var.self), "_", i), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// There is no qualified alias since we need to flatten the internal array on return.
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			uint32_t comp = get_decoration(var.self, DecorationComponent);
			if (storage == StorageClassInput)
			{
				var.basetype = ensure_correct_input_type(var.basetype, locn, comp, 0, meta.strip_array);
				uint32_t mbr_type_id = ensure_correct_input_type(usable_type->self, locn, comp, 0, meta.strip_array);
				if (storage == StorageClassInput && pull_model_inputs.count(var.self))
					ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
				else
					ib_type.member_types[ib_mbr_idx] = mbr_type_id;
			}
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			if (comp)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
		{
			uint32_t locn = outputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance))
		{
			// Declare the Clip/CullDistance as [[user(clip/cullN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, i);
		}

		if (get_decoration_bitset(var.self).get(DecorationIndex))
		{
			uint32_t index = get_decoration(var.self, DecorationIndex);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
		}

		if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
		{
			// Copy interpolation decorations if needed
			if (is_flat)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
			if (is_noperspective)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
			if (is_centroid)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
			if (is_sample)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
		}

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);

		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		if (!meta.strip_array)
		{
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					if (pull_model_inputs.count(var.self))
					{
						string lerp_call;
						if (is_centroid)
							lerp_call = ".interpolate_at_centroid()";
						else if (is_sample)
							lerp_call = join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
						else
							lerp_call = ".interpolate_at_center()";
						statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, lerp_call, ";");
					}
					else
					{
						statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, ";");
					}
				});
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=, &var]() {
					if (padded_output)
					{
						auto &padded_type = this->get<SPIRType>(type_id);
						statement(
						    ib_var_ref, ".", mbr_name, " = ",
						    remap_swizzle(padded_type, usable_type->vecsize, join(to_name(var.self), "[", i, "]")),
						    ";");
					}
					else if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i,
						          "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", to_name(var.self), "[", i, "];");
				});
				break;

			default:
				break;
			}
		}
	}
}